

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O3

void run_schnorrsig_tests(void)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  undefined4 uVar7;
  undefined4 uVar8;
  secp256k1_context *psVar9;
  uint32_t uVar10;
  int iVar11;
  uint32_t uVar12;
  uint uVar13;
  long lVar14;
  secp256k1_context *extraout_RAX;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  secp256k1_context *extraout_RAX_03;
  secp256k1_context *extraout_RAX_04;
  secp256k1_context *extraout_RAX_05;
  secp256k1_context *extraout_RAX_06;
  secp256k1_context *extraout_RAX_07;
  secp256k1_context *extraout_RAX_08;
  secp256k1_context *extraout_RAX_09;
  secp256k1_context *extraout_RAX_10;
  secp256k1_context *extraout_RAX_11;
  secp256k1_context *extraout_RAX_12;
  secp256k1_context *psVar15;
  secp256k1_context *extraout_RAX_13;
  size_t in_RCX;
  ulong uVar16;
  secp256k1_fe *a;
  int iVar17;
  secp256k1_fe *a_00;
  ulong uVar18;
  ulong uVar19;
  size_t in_R8;
  uchar *puVar20;
  uchar *sig64;
  ulong uVar21;
  byte bVar22;
  secp256k1_xonly_pubkey *pubkey;
  int32_t _calls_to_callback;
  secp256k1_callback _saved_callback;
  uchar aux_rand [32];
  uchar algo [13];
  uchar nonce_z [32];
  uchar *args [5];
  uchar key [32];
  uchar pk [32];
  uchar msg [32];
  uchar nonce [32];
  secp256k1_xonly_pubkey pk_1 [3];
  secp256k1_sha256 sha;
  secp256k1_schnorrsig_extraparams invalid_extraparams;
  int local_3ec;
  _func_void_char_ptr_void_ptr *local_3e8;
  void *pvStack_3e0;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  secp256k1_schnorrsig_extraparams local_3b8;
  secp256k1_xonly_pubkey local_398;
  undefined1 local_358 [8];
  uchar *puStack_350;
  uchar *local_348;
  secp256k1_schnorrsig_extraparams *psStack_340;
  uchar *local_338;
  uint64_t uStack_330;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [64];
  secp256k1_fe local_2b8;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_228 [96];
  _func_void_char_ptr_void_ptr *local_1c8;
  secp256k1_xonly_pubkey local_1a8;
  undefined1 local_168 [192];
  secp256k1_keypair local_a8;
  undefined1 local_48 [16];
  void *local_38;
  
  uStack_330 = (uint64_t)local_338;
  local_3b8.noncefp._0_5_ = 0x65636e6f6e;
  builtin_memcpy(local_3b8.magic,"BIP0",4);
  local_3b8._4_4_ = 0x2f303433;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_168,"BIP0340/nonce",0xd);
  local_228._0_8_ = 0xf4bfbff746615b35;
  local_228._8_8_ = 0x83627ab39f8dc671;
  local_228._16_8_ = 0x5735866160217180;
  local_228._24_8_ = 0x68b07b4c21a29e54;
  local_1c8 = (_func_void_char_ptr_void_ptr *)0x40;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  secp256k1_sha256_initialize_tagged
            ((secp256k1_sha256 *)local_168,"BIP0340/auxBIP0340/nonceBIP0340/challenge",0xb);
  local_228._0_8_ = 0x4eba7e7024dd3219;
  local_228._8_8_ = 0xfa3166dca0fabb9;
  local_228._16_8_ = 0x4c44df973afbe4b1;
  local_228._24_8_ = 0x249e850a4aac2739;
  local_1c8 = (_func_void_char_ptr_void_ptr *)0x40;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  testrand256((uchar *)&local_2b8);
  testrand256(local_2f8);
  puVar20 = local_2f8 + 0x20;
  testrand256(puVar20);
  testrand256(local_3d8);
  local_348 = puVar20;
  psStack_340 = &local_3b8;
  local_358 = (undefined1  [8])&local_2b8;
  puStack_350 = local_2f8;
  local_338 = local_3d8;
  if (0 < COUNT) {
    iVar17 = 0;
    do {
      nonce_function_bip340_bitflip((uchar **)local_358,0,0x20,in_RCX,in_R8);
      nonce_function_bip340_bitflip((uchar **)local_358,1,0x20,in_RCX,in_R8);
      nonce_function_bip340_bitflip((uchar **)local_358,2,0x20,in_RCX,in_R8);
      nonce_function_bip340_bitflip((uchar **)local_358,3,0xd,in_RCX,in_R8);
      nonce_function_bip340_bitflip((uchar **)local_358,3,0xd,in_RCX,in_R8);
      nonce_function_bip340_bitflip((uchar **)local_358,4,0x20,in_RCX,in_R8);
      iVar17 = iVar17 + 1;
    } while (iVar17 < COUNT);
  }
  iVar17 = nonce_function_bip340
                     (local_288,(uchar *)&local_2b8,0x20,local_2f8,local_2f8 + 0x20,local_3b8.magic,
                      0xd,(void *)0x0);
  if (iVar17 == 0) goto LAB_0013fb04;
  testrand_bytes_test(local_3b8.magic,0xd);
  iVar17 = nonce_function_bip340
                     (local_288,(uchar *)&local_2b8,0x20,local_2f8,local_2f8 + 0x20,local_3b8.magic,
                      0xd,(void *)0x0);
  if (iVar17 == 0) goto LAB_0013fb09;
  if (0 < COUNT) {
    iVar17 = 0;
    do {
      uVar10 = testrand_int(0x1f);
      iVar11 = nonce_function_bip340
                         (local_398.data,(uchar *)&local_2b8,(ulong)(uVar10 & 0x1f),local_2f8,
                          local_2f8 + 0x20,local_3b8.magic,0xd,(void *)0x0);
      if (iVar11 == 0) goto LAB_0013fa5a;
      lVar14 = 0;
      while (local_288[lVar14] == local_398.data[lVar14]) {
        lVar14 = lVar14 + 1;
        if (lVar14 == 0x20) goto LAB_0013fafa;
      }
      uVar10 = testrand_int(0xc);
      iVar11 = nonce_function_bip340
                         (local_398.data,(uchar *)&local_2b8,0x20,local_2f8,local_2f8 + 0x20,
                          local_3b8.magic,((ulong)uVar10 + 0xd) % 0xd,(void *)0x0);
      if (iVar11 == 0) goto LAB_0013fa5f;
      lVar14 = 0;
      while (local_288[lVar14] == local_398.data[lVar14]) {
        lVar14 = lVar14 + 1;
        if (lVar14 == 0x20) goto LAB_0013faff;
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 < COUNT);
  }
  local_3c8 = (undefined1  [16])0x0;
  local_3d8 = (undefined1  [16])0x0;
  iVar17 = nonce_function_bip340
                     (local_398.data,(uchar *)&local_2b8,0x20,local_2f8,local_2f8 + 0x20,
                      local_3b8.magic,0xd,local_3d8);
  if (iVar17 == 0) goto LAB_0013fb0e;
  psVar15 = (secp256k1_context *)local_288;
  a_00 = &local_2b8;
  iVar17 = nonce_function_bip340
                     ((uchar *)psVar15,(uchar *)a_00,0x20,local_2f8,local_2f8 + 0x20,local_3b8.magic
                      ,0xd,(void *)0x0);
  if (iVar17 == 0) goto LAB_0013fb13;
  lVar14 = 0;
  do {
    if (local_398.data[lVar14] != local_288[lVar14]) goto LAB_0013fe29;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x20);
  local_308 = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_328 = (undefined1  [16])0x0;
  local_338 = (uchar *)0x0;
  uStack_330 = 0;
  local_348 = (uchar *)0x0;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x0;
  local_358 = (undefined1  [8])0x0;
  puStack_350 = (uchar *)0x0;
  local_3b8.ndata = (void *)0x0;
  local_3b8.magic[0] = 0xda;
  local_3b8.magic[1] = 'o';
  local_3b8.magic[2] = 0xb3;
  local_3b8.magic[3] = 0x8c;
  local_3b8._4_4_ = 0;
  local_3b8.noncefp._0_5_ = 0;
  local_3b8.noncefp._5_3_ = 0;
  local_48 = (undefined1  [16])0x0;
  local_38 = (void *)0x0;
  testrand256((uchar *)&local_2b8);
  testrand256(local_2f8);
  testrand256(local_2f8 + 0x20);
  testrand256(local_3d8);
  iVar17 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,(uchar *)&local_2b8);
  if (iVar17 == 0) goto LAB_0013fb18;
  iVar17 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)(local_168 + 0x60),local_2f8);
  if (iVar17 == 0) goto LAB_0013fb1d;
  iVar17 = secp256k1_keypair_create(CTX,&local_a8,local_2f8 + 0x20);
  if (iVar17 == 0) goto LAB_0013fb22;
  iVar17 = secp256k1_keypair_xonly_pub
                     (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                      (secp256k1_keypair *)local_168);
  if (iVar17 == 0) goto LAB_0013fb27;
  iVar17 = secp256k1_keypair_xonly_pub
                     (CTX,(secp256k1_xonly_pubkey *)(local_228 + 0x40),(int *)0x0,
                      (secp256k1_keypair *)(local_168 + 0x60));
  if (iVar17 == 0) goto LAB_0013fb2c;
  iVar17 = secp256k1_keypair_xonly_pub(CTX,&local_1a8,(int *)0x0,&local_a8);
  if (iVar17 == 0) goto LAB_0013fb31;
  local_258 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  iVar17 = secp256k1_schnorrsig_sign_internal
                     (CTX,local_398.data,local_3d8,0x20,(secp256k1_keypair *)local_168,
                      nonce_function_bip340,(void *)0x0);
  psVar15 = CTX;
  if (iVar17 == 0) goto LAB_0013fb36;
  local_3ec = 0;
  local_3e8 = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  if (secp256k1_context_static == CTX) goto LAB_0013fb3b;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar15->illegal_callback).data = &local_3ec;
  do {
    iVar17 = secp256k1_schnorrsig_sign_internal
                       (psVar15,(uchar *)0x0,local_3d8,0x20,(secp256k1_keypair *)local_168,
                        nonce_function_bip340,(void *)0x0);
    psVar15 = CTX;
    if (iVar17 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar15->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013fb60;
      local_3ec = 0;
      local_3e8 = (psVar15->illegal_callback).fn;
      pvStack_3e0 = (psVar15->illegal_callback).data;
      if (secp256k1_context_static == psVar15) goto LAB_0013fb65;
      (psVar15->illegal_callback).fn = counting_callback_fn;
      (psVar15->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_2();
LAB_0013fb60:
      run_schnorrsig_tests_cold_3();
      psVar15 = extraout_RAX_00;
LAB_0013fb65:
      (*(psVar15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar15->illegal_callback).data);
      psVar15 = CTX;
    }
    iVar17 = secp256k1_schnorrsig_sign_internal
                       (psVar15,local_398.data,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                        nonce_function_bip340,(void *)0x0);
    psVar15 = CTX;
    if (iVar17 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar15->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013fb8a;
      local_3ec = 0;
      local_3e8 = (psVar15->illegal_callback).fn;
      pvStack_3e0 = (psVar15->illegal_callback).data;
      if (secp256k1_context_static == psVar15) goto LAB_0013fb8f;
      (psVar15->illegal_callback).fn = counting_callback_fn;
      (psVar15->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_4();
LAB_0013fb8a:
      run_schnorrsig_tests_cold_5();
      psVar15 = extraout_RAX_01;
LAB_0013fb8f:
      (*(psVar15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar15->illegal_callback).data);
      psVar15 = CTX;
    }
    iVar17 = secp256k1_schnorrsig_sign_internal
                       (psVar15,local_398.data,local_3d8,0x20,(secp256k1_keypair *)0x0,
                        nonce_function_bip340,(void *)0x0);
    psVar15 = CTX;
    if (iVar17 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar15->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013fbb4;
      local_3ec = 0;
      local_3e8 = (psVar15->illegal_callback).fn;
      pvStack_3e0 = (psVar15->illegal_callback).data;
      if (secp256k1_context_static == psVar15) goto LAB_0013fbb9;
      (psVar15->illegal_callback).fn = counting_callback_fn;
      (psVar15->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_6();
LAB_0013fbb4:
      run_schnorrsig_tests_cold_7();
      psVar15 = extraout_RAX_02;
LAB_0013fbb9:
      (*(psVar15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar15->illegal_callback).data);
      psVar15 = CTX;
    }
    iVar17 = secp256k1_schnorrsig_sign_internal
                       (psVar15,local_398.data,local_3d8,0x20,(secp256k1_keypair *)local_358,
                        nonce_function_bip340,(void *)0x0);
    psVar15 = CTX;
    if (iVar17 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar15->illegal_callback).data = pvStack_3e0;
      psVar15 = STATIC_CTX;
      if (local_3ec != 1) goto LAB_0013fbde;
      local_3ec = 0;
      local_3e8 = (STATIC_CTX->illegal_callback).fn;
      pvStack_3e0 = (STATIC_CTX->illegal_callback).data;
      if (secp256k1_context_static == STATIC_CTX) goto LAB_0013fbe3;
      (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
      (psVar15->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_8();
LAB_0013fbde:
      run_schnorrsig_tests_cold_9();
      psVar15 = extraout_RAX_03;
LAB_0013fbe3:
      (*(psVar15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar15->illegal_callback).data);
      psVar15 = STATIC_CTX;
    }
    iVar17 = secp256k1_schnorrsig_sign_internal
                       (psVar15,local_398.data,local_3d8,0x20,(secp256k1_keypair *)local_168,
                        nonce_function_bip340,(void *)0x0);
    psVar15 = STATIC_CTX;
    if (iVar17 == 0) {
      (STATIC_CTX->illegal_callback).fn = local_3e8;
      (psVar15->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013fc08;
      iVar17 = secp256k1_schnorrsig_sign_custom
                         (CTX,local_398.data,local_3d8,0x20,(secp256k1_keypair *)local_168,
                          &local_3b8);
      psVar15 = CTX;
      if (iVar17 == 0) goto LAB_0013fc0d;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_0013fc12;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar15->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_10();
LAB_0013fc08:
      run_schnorrsig_tests_cold_11();
LAB_0013fc0d:
      run_schnorrsig_tests_cold_87();
      psVar15 = extraout_RAX_04;
LAB_0013fc12:
      (*(psVar15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar15->illegal_callback).data);
      psVar15 = CTX;
    }
    iVar17 = secp256k1_schnorrsig_sign_custom
                       (psVar15,(uchar *)0x0,local_3d8,0x20,(secp256k1_keypair *)local_168,
                        &local_3b8);
    psVar15 = CTX;
    if (iVar17 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar15->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013fc37;
      local_3ec = 0;
      local_3e8 = (psVar15->illegal_callback).fn;
      pvStack_3e0 = (psVar15->illegal_callback).data;
      if (secp256k1_context_static == psVar15) goto LAB_0013fc3c;
      (psVar15->illegal_callback).fn = counting_callback_fn;
      (psVar15->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_12();
LAB_0013fc37:
      run_schnorrsig_tests_cold_13();
      psVar15 = extraout_RAX_05;
LAB_0013fc3c:
      (*(psVar15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar15->illegal_callback).data);
      psVar15 = CTX;
    }
    iVar17 = secp256k1_schnorrsig_sign_custom
                       (psVar15,local_398.data,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                        &local_3b8);
    psVar15 = CTX;
    if (iVar17 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar15->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013fc61;
      iVar17 = secp256k1_schnorrsig_sign_custom
                         (psVar15,local_398.data,(uchar *)0x0,0,(secp256k1_keypair *)local_168,
                          &local_3b8);
      psVar15 = CTX;
      if (iVar17 == 0) goto LAB_0013fc66;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_0013fc6b;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar15->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_14();
LAB_0013fc61:
      run_schnorrsig_tests_cold_15();
LAB_0013fc66:
      run_schnorrsig_tests_cold_86();
      psVar15 = extraout_RAX_06;
LAB_0013fc6b:
      (*(psVar15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar15->illegal_callback).data);
      psVar15 = CTX;
    }
    iVar17 = secp256k1_schnorrsig_sign_custom
                       (psVar15,local_398.data,local_3d8,0x20,(secp256k1_keypair *)0x0,&local_3b8);
    psVar15 = CTX;
    if (iVar17 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar15->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013fc90;
      local_3ec = 0;
      local_3e8 = (psVar15->illegal_callback).fn;
      pvStack_3e0 = (psVar15->illegal_callback).data;
      if (secp256k1_context_static == psVar15) goto LAB_0013fc95;
      (psVar15->illegal_callback).fn = counting_callback_fn;
      (psVar15->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_16();
LAB_0013fc90:
      run_schnorrsig_tests_cold_17();
      psVar15 = extraout_RAX_07;
LAB_0013fc95:
      (*(psVar15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar15->illegal_callback).data);
      psVar15 = CTX;
    }
    iVar17 = secp256k1_schnorrsig_sign_custom
                       (psVar15,local_398.data,local_3d8,0x20,(secp256k1_keypair *)local_358,
                        &local_3b8);
    psVar15 = CTX;
    if (iVar17 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar15->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013fcba;
      iVar17 = secp256k1_schnorrsig_sign_internal
                         (psVar15,local_398.data,local_3d8,0x20,(secp256k1_keypair *)local_168,
                          (secp256k1_nonce_function_hardened)0x0,(void *)0x0);
      psVar15 = CTX;
      if (iVar17 == 0) goto LAB_0013fcbf;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_0013fcc4;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar15->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_18();
LAB_0013fcba:
      run_schnorrsig_tests_cold_19();
LAB_0013fcbf:
      run_schnorrsig_tests_cold_85();
      psVar15 = extraout_RAX_08;
LAB_0013fcc4:
      (*(psVar15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar15->illegal_callback).data);
      psVar15 = CTX;
    }
    iVar17 = secp256k1_schnorrsig_sign_custom
                       (psVar15,local_398.data,local_3d8,0x20,(secp256k1_keypair *)local_168,
                        (secp256k1_schnorrsig_extraparams *)local_48);
    psVar15 = CTX;
    if (iVar17 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar15->illegal_callback).data = pvStack_3e0;
      psVar15 = STATIC_CTX;
      if (local_3ec != 1) goto LAB_0013fce9;
      local_3ec = 0;
      local_3e8 = (STATIC_CTX->illegal_callback).fn;
      pvStack_3e0 = (STATIC_CTX->illegal_callback).data;
      if (secp256k1_context_static == STATIC_CTX) goto LAB_0013fcee;
      (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
      (psVar15->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_20();
LAB_0013fce9:
      run_schnorrsig_tests_cold_21();
      psVar15 = extraout_RAX_09;
LAB_0013fcee:
      (*(psVar15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar15->illegal_callback).data);
      psVar15 = STATIC_CTX;
    }
    iVar17 = secp256k1_schnorrsig_sign_custom
                       (psVar15,local_398.data,local_3d8,0x20,(secp256k1_keypair *)local_168,
                        &local_3b8);
    psVar15 = STATIC_CTX;
    if (iVar17 == 0) {
      (STATIC_CTX->illegal_callback).fn = local_3e8;
      (psVar15->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013fd13;
      iVar17 = secp256k1_schnorrsig_sign_internal
                         (CTX,local_398.data,local_3d8,0x20,(secp256k1_keypair *)local_168,
                          nonce_function_bip340,(void *)0x0);
      if (iVar17 == 0) goto LAB_0013fd18;
      iVar17 = secp256k1_schnorrsig_verify
                         (CTX,local_398.data,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_228);
      psVar15 = CTX;
      if (iVar17 == 0) goto LAB_0013fd1d;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_0013fd22;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar15->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_22();
LAB_0013fd13:
      run_schnorrsig_tests_cold_23();
LAB_0013fd18:
      run_schnorrsig_tests_cold_84();
LAB_0013fd1d:
      run_schnorrsig_tests_cold_83();
      psVar15 = extraout_RAX_10;
LAB_0013fd22:
      (*(psVar15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar15->illegal_callback).data);
      psVar15 = CTX;
    }
    iVar17 = secp256k1_schnorrsig_verify
                       (psVar15,(uchar *)0x0,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_228);
    psVar15 = CTX;
    if (iVar17 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar15->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013fd47;
      local_3ec = 0;
      local_3e8 = (psVar15->illegal_callback).fn;
      pvStack_3e0 = (psVar15->illegal_callback).data;
      if (secp256k1_context_static == psVar15) goto LAB_0013fd4c;
      (psVar15->illegal_callback).fn = counting_callback_fn;
      (psVar15->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_24();
LAB_0013fd47:
      run_schnorrsig_tests_cold_25();
      psVar15 = extraout_RAX_11;
LAB_0013fd4c:
      (*(psVar15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar15->illegal_callback).data);
      psVar15 = CTX;
    }
    iVar17 = secp256k1_schnorrsig_verify
                       (psVar15,local_398.data,(uchar *)0x0,0x20,(secp256k1_xonly_pubkey *)local_228
                       );
    psVar15 = CTX;
    if (iVar17 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar15->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013fd71;
      iVar17 = secp256k1_schnorrsig_verify
                         (psVar15,local_398.data,(uchar *)0x0,0,(secp256k1_xonly_pubkey *)local_228)
      ;
      psVar15 = CTX;
      if (iVar17 != 0) goto LAB_0013fd76;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_0013fd7b;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar15->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_26();
LAB_0013fd71:
      run_schnorrsig_tests_cold_27();
LAB_0013fd76:
      run_schnorrsig_tests_cold_28();
      psVar15 = extraout_RAX_12;
LAB_0013fd7b:
      (*(psVar15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar15->illegal_callback).data);
      psVar15 = CTX;
    }
    iVar17 = secp256k1_schnorrsig_verify
                       (psVar15,local_398.data,local_3d8,0x20,(secp256k1_xonly_pubkey *)0x0);
    psVar15 = CTX;
    if (iVar17 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar15->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013fda0;
      local_3ec = 0;
      local_3e8 = (psVar15->illegal_callback).fn;
      pvStack_3e0 = (psVar15->illegal_callback).data;
      if (secp256k1_context_static == psVar15) goto LAB_0013fda5;
      (psVar15->illegal_callback).fn = counting_callback_fn;
      (psVar15->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_29();
LAB_0013fda0:
      run_schnorrsig_tests_cold_30();
      psVar15 = extraout_RAX_13;
LAB_0013fda5:
      (*(psVar15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar15->illegal_callback).data);
      psVar15 = CTX;
    }
    a_00 = (secp256k1_fe *)&local_398;
    iVar17 = secp256k1_schnorrsig_verify
                       (psVar15,(uchar *)a_00,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_288);
    psVar9 = CTX;
    if (iVar17 != 0) {
      run_schnorrsig_tests_cold_31();
LAB_0013fdca:
      run_schnorrsig_tests_cold_32();
LAB_0013fdcf:
      run_schnorrsig_tests_cold_33();
LAB_0013fdd4:
      run_schnorrsig_tests_cold_34();
LAB_0013fdd9:
      run_schnorrsig_tests_cold_58();
LAB_0013fdde:
      run_schnorrsig_tests_cold_57();
LAB_0013fde3:
      run_schnorrsig_tests_cold_56();
LAB_0013fde8:
      run_schnorrsig_tests_cold_47();
LAB_0013fded:
      run_schnorrsig_tests_cold_55();
LAB_0013fdf2:
      run_schnorrsig_tests_cold_54();
LAB_0013fdf7:
      run_schnorrsig_tests_cold_53();
LAB_0013fdfc:
      run_schnorrsig_tests_cold_52();
LAB_0013fe01:
      run_schnorrsig_tests_cold_51();
LAB_0013fe06:
      run_schnorrsig_tests_cold_50();
LAB_0013fe0b:
      run_schnorrsig_tests_cold_49();
LAB_0013fe10:
      run_schnorrsig_tests_cold_48();
LAB_0013fe15:
      run_schnorrsig_tests_cold_35();
LAB_0013fe1a:
      run_schnorrsig_tests_cold_37();
LAB_0013fe1f:
      run_schnorrsig_tests_cold_39();
LAB_0013fe24:
      run_schnorrsig_tests_cold_40();
LAB_0013fe29:
      run_schnorrsig_tests_cold_1();
      secp256k1_fe_verify(a_00);
      secp256k1_fe_verify(a);
      *(undefined4 *)((psVar15->ecmult_gen_ctx).ge_offset.y.n + 1) = 0;
      uVar1 = a_00->n[1];
      uVar2 = a_00->n[2];
      uVar3 = a_00->n[3];
      uVar4 = a_00->n[4];
      uVar5 = *(uint64_t *)&a_00->magnitude;
      *(uint64_t *)&psVar15->ecmult_gen_ctx = a_00->n[0];
      (psVar15->ecmult_gen_ctx).scalar_offset.d[0] = uVar1;
      (psVar15->ecmult_gen_ctx).scalar_offset.d[1] = uVar2;
      (psVar15->ecmult_gen_ctx).scalar_offset.d[2] = uVar3;
      (psVar15->ecmult_gen_ctx).scalar_offset.d[3] = uVar4;
      (psVar15->ecmult_gen_ctx).ge_offset.x.n[0] = uVar5;
      uVar1 = a->n[1];
      uVar2 = a->n[2];
      uVar3 = a->n[3];
      uVar7 = *(undefined4 *)(a->n + 4);
      uVar8 = *(undefined4 *)((long)(a->n + 4) + 4);
      uVar4 = *(uint64_t *)&a->magnitude;
      (psVar15->ecmult_gen_ctx).ge_offset.x.n[1] = a->n[0];
      (psVar15->ecmult_gen_ctx).ge_offset.x.n[2] = uVar1;
      (psVar15->ecmult_gen_ctx).ge_offset.x.n[3] = uVar2;
      (psVar15->ecmult_gen_ctx).ge_offset.x.n[4] = uVar3;
      (psVar15->ecmult_gen_ctx).ge_offset.x.magnitude = uVar7;
      (psVar15->ecmult_gen_ctx).ge_offset.x.normalized = uVar8;
      (psVar15->ecmult_gen_ctx).ge_offset.y.n[0] = uVar4;
      secp256k1_ge_verify((secp256k1_ge *)psVar15);
      return;
    }
    (CTX->illegal_callback).fn = local_3e8;
    (psVar9->illegal_callback).data = pvStack_3e0;
    if (local_3ec != 1) goto LAB_0013fdca;
    secp256k1_sha256_initialize_tagged
              ((secp256k1_sha256 *)local_168,(uchar *)"BIP0340/challenge",0x11);
    local_228._0_8_ = 0x239253819cecba11;
    local_228._8_8_ = 0xd1627e0f11679112;
    local_228._16_8_ = 0x3cc76597c87550;
    local_228._24_8_ = 0x33e9b66a90f61164;
    local_1c8 = (_func_void_char_ptr_void_ptr *)0x40;
    test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
    local_228._16_8_ = 0;
    local_228._24_8_ = 0x300000000000000;
    local_228._0_8_ = 0;
    local_228._8_8_ = 0;
    local_348 = (uchar *)0xb0996f8345c831b5;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0xf936e0bc13f10186;
    local_358 = (undefined1  [8])0x10c35892018a30f9;
    puStack_350 = (uchar *)0x29529df8854f3449;
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    local_398.data[0x10] = '\0';
    local_398.data[0x11] = '\0';
    local_398.data[0x12] = '\0';
    local_398.data[0x13] = '\0';
    local_398.data[0x14] = '\0';
    local_398.data[0x15] = '\0';
    local_398.data[0x16] = '\0';
    local_398.data[0x17] = '\0';
    local_398.data[0x18] = '\0';
    local_398.data[0x19] = '\0';
    local_398.data[0x1a] = '\0';
    local_398.data[0x1b] = '\0';
    local_398.data[0x1c] = '\0';
    local_398.data[0x1d] = '\0';
    local_398.data[0x1e] = '\0';
    local_398.data[0x1f] = '\0';
    local_398.data[0] = '\0';
    local_398.data[1] = '\0';
    local_398.data[2] = '\0';
    local_398.data[3] = '\0';
    local_398.data[4] = '\0';
    local_398.data[5] = '\0';
    local_398.data[6] = '\0';
    local_398.data[7] = '\0';
    local_398.data[8] = '\0';
    local_398.data[9] = '\0';
    local_398.data[10] = '\0';
    local_398.data[0xb] = '\0';
    local_398.data[0xc] = '\0';
    local_398.data[0xd] = '\0';
    local_398.data[0xe] = '\0';
    local_398.data[0xf] = '\0';
    local_168[0x30] = 0xeb;
    local_168[0x31] = 0xee;
    local_168[0x32] = 0xe8;
    local_168[0x33] = 0xfd;
    local_168[0x34] = 0xb2;
    local_168[0x35] = '\x17';
    local_168[0x36] = '/';
    local_168[0x37] = 'G';
    local_168[0x38] = '}';
    local_168[0x39] = 0xf4;
    local_168[0x3a] = 0x90;
    local_168[0x3b] = '\r';
    local_168[0x3c] = '1';
    local_168[0x3d] = '\x05';
    local_168[0x3e] = '6';
    local_168[0x3f] = 0xc0;
    local_168._32_8_ = 0x718bea854a6af625;
    local_168[0x28] = 0xe4;
    local_168[0x29] = 0x82;
    local_168[0x2a] = 0xa7;
    local_168[0x2b] = 'O';
    local_168[0x2c] = '8';
    local_168[0x2d] = '-';
    local_168[0x2e] = ',';
    local_168[0x2f] = 0xe5;
    local_168._16_8_ = 0x8b007835f1cdf4b;
    local_168._24_8_ = 0x1582ca2dcef1554c;
    local_168._0_8_ = 0x108d84801f8307e9;
    local_168._8_8_ = 0x361024401b37a569;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288,local_398.data,0x20,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,0x20,local_168,1);
    local_228._16_8_ = 0x56dab4380f16e762;
    local_228._24_8_ = 0xefcf905104d984a7;
    local_228._0_8_ = 0x6a2aed8a6251e1b7;
    local_228._8_8_ = 0xc7f3f49c805871bf;
    local_348 = (uchar *)0xd8cedea21daefe58;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x59a62b507b0f2443;
    local_358 = (undefined1  [8])0x5f1c672a7fd7f1df;
    puStack_350 = (uchar *)0xbe4123db26371836;
    local_278._0_8_ = 0;
    local_278._8_8_ = 0x100000000000000;
    local_288 = ZEXT816(0);
    local_398.data[0x10] = 0xa4;
    local_398.data[0x11] = '\t';
    local_398.data[0x12] = '8';
    local_398.data[0x13] = '\"';
    local_398.data[0x14] = ')';
    local_398.data[0x15] = 0x9f;
    local_398.data[0x16] = '1';
    local_398.data[0x17] = 0xd0;
    local_398.data[0x18] = '\b';
    local_398.data[0x19] = '.';
    local_398.data[0x1a] = 0xfa;
    local_398.data[0x1b] = 0x98;
    local_398.data[0x1c] = 0xec;
    local_398.data[0x1d] = 'N';
    local_398.data[0x1e] = 'l';
    local_398.data[0x1f] = 0x89;
    local_398.data[0] = '$';
    local_398.data[1] = '?';
    local_398.data[2] = 'j';
    local_398.data[3] = 0x88;
    local_398.data[4] = 0x85;
    local_398.data[5] = 0xa3;
    local_398.data[6] = '\b';
    local_398.data[7] = 0xd3;
    local_398.data[8] = '\x13';
    local_398.data[9] = '\x19';
    local_398.data[10] = 0x8a;
    local_398.data[0xb] = '.';
    local_398.data[0xc] = '\x03';
    local_398.data[0xd] = 'p';
    local_398.data[0xe] = 's';
    local_398.data[0xf] = 'D';
    local_168[0x30] = 0x89;
    local_168[0x31] = '~';
    local_168[0x32] = 0xfc;
    local_168[0x33] = 0xb6;
    local_168[0x34] = '9';
    local_168[0x35] = 0xea;
    local_168[0x36] = 0x87;
    local_168[0x37] = '\x1c';
    local_168[0x38] = 0xfa;
    local_168[0x39] = 0x95;
    local_168[0x3a] = 0xf6;
    local_168[0x3b] = 0xde;
    local_168[0x3c] = '3';
    local_168[0x3d] = 0x9e;
    local_168[0x3e] = 'K';
    local_168[0x3f] = '\n';
    local_168._32_8_ = 0xccab76c91ad10689;
    local_168[0x28] = 0xb2;
    local_168[0x29] = '\v';
    local_168[0x2a] = '\t';
    local_168[0x2b] = '\x12';
    local_168[0x2c] = 0x92;
    local_168[0x2d] = 0xbf;
    local_168[0x2e] = 0xf4;
    local_168[0x2f] = 0xea;
    local_168._16_8_ = 0x17f9436d3e41de1b;
    local_168._24_8_ = 0x4133de788ccf8ddc;
    local_168._0_8_ = 0x6d29aeee60bd9668;
    local_168._8_8_ = 0x7fe1df79f228ab4;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288,local_398.data,0x20,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,0x20,local_168,1);
    local_228._16_8_ = 0x74cc678a084e0229;
    local_228._24_8_ = 0xc9e5143ba6be0b02;
    local_228._0_8_ = 0x34c26821a2da0fc9;
    local_228._8_8_ = 0xd11cdc808b62c6c4;
    local_348 = (uchar *)0xc986b00953713901;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0xb84e7769d98fe160;
    local_358 = (undefined1  [8])0x137e77c5fe8a30dd;
    puStack_350 = (uchar *)0xccb7c19c2ba71f12;
    local_278._8_8_ = 0x6d9e698d7620b4b;
    local_278._0_8_ = 0x2c69d1c6cd760e08;
    local_288._8_8_ = 0xccbcbbb5a235b02e;
    local_288._0_8_ = 0xaed7b42438a57ac8;
    local_398.data[0x10] = 0xda;
    local_398.data[0x11] = 0x98;
    local_398.data[0x12] = '\x05';
    local_398.data[0x13] = 0xaa;
    local_398.data[0x14] = 0xb5;
    local_398.data[0x15] = 'l';
    local_398.data[0x16] = 'w';
    local_398.data[0x17] = '3';
    local_398.data[0x18] = '0';
    local_398.data[0x19] = '$';
    local_398.data[0x1a] = 0xb9;
    local_398.data[0x1b] = 0xd0;
    local_398.data[0x1c] = 0xa5;
    local_398.data[0x1d] = '\b';
    local_398.data[0x1e] = 0xb7;
    local_398.data[0x1f] = '\\';
    local_398.data[0] = '~';
    local_398.data[1] = '-';
    local_398.data[2] = 'X';
    local_398.data[3] = 0xd8;
    local_398.data[4] = 0xb3;
    local_398.data[5] = 0xbc;
    local_398.data[6] = 0xdf;
    local_398.data[7] = '\x1a';
    local_398.data[8] = 0xba;
    local_398.data[9] = 0xde;
    local_398.data[10] = 199;
    local_398.data[0xb] = 0x82;
    local_398.data[0xc] = 0x90;
    local_398.data[0xd] = 'T';
    local_398.data[0xe] = 0xf9;
    local_398.data[0xf] = '\r';
    local_168[0x30] = 'z';
    local_168[0x31] = 0xde;
    local_168[0x32] = 0xa9;
    local_168[0x33] = 0x8d;
    local_168[0x34] = 0x82;
    local_168[0x35] = 0xf8;
    local_168[0x36] = 'H';
    local_168[0x37] = '\x1e';
    local_168[0x38] = '\x0e';
    local_168[0x39] = '\x1e';
    local_168[0x3a] = '\x03';
    local_168[0x3b] = 'g';
    local_168[0x3c] = 'J';
    local_168[0x3d] = 'o';
    local_168[0x3e] = '?';
    local_168[0x3f] = 0xb7;
    local_168._32_8_ = 0x4a95ada5795874ab;
    local_168[0x28] = 'r';
    local_168[0x29] = 0xc4;
    local_168[0x2a] = 'Z';
    local_168[0x2b] = 0x91;
    local_168[0x2c] = 0xc3;
    local_168[0x2d] = 0xa5;
    local_168[0x2e] = '\x1d';
    local_168[0x2f] = '<';
    local_168._16_8_ = 0x8b8d72602acf9bc4;
    local_168._24_8_ = 0x1b3c31dd500f204c;
    local_168._0_8_ = 0xb74bb4d7eeaa3158;
    local_168._8_8_ = 0x94429dba94ab5e4e;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288,local_398.data,0x20,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,0x20,local_168,1);
    local_228._16_8_ = 0x54a23fcf62307712;
    local_228._24_8_ = 0x101740d28ef5449e;
    local_228._0_8_ = 0x81739377262b430b;
    local_228._8_8_ = 0xd0ec662ab05bf0ae;
    local_348 = (uchar *)0x8a461df2fb950d3a;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17f5d860c1f8331b;
    local_358 = (undefined1  [8])0x25f50551f9dfd125;
    puStack_350 = (uchar *)0xad96a928f622403c;
    local_278._8_4_ = 0xffffffff;
    local_278._0_8_ = 0xffffffffffffffff;
    local_278._12_4_ = 0xffffffff;
    local_288._8_4_ = 0xffffffff;
    local_288._0_8_ = 0xffffffffffffffff;
    local_288._12_4_ = 0xffffffff;
    local_398.data[0x10] = 0xff;
    local_398.data[0x11] = 0xff;
    local_398.data[0x12] = 0xff;
    local_398.data[0x13] = 0xff;
    local_398.data[0x14] = 0xff;
    local_398.data[0x15] = 0xff;
    local_398.data[0x16] = 0xff;
    local_398.data[0x17] = 0xff;
    local_398.data[0x18] = 0xff;
    local_398.data[0x19] = 0xff;
    local_398.data[0x1a] = 0xff;
    local_398.data[0x1b] = 0xff;
    local_398.data[0x1c] = 0xff;
    local_398.data[0x1d] = 0xff;
    local_398.data[0x1e] = 0xff;
    local_398.data[0x1f] = 0xff;
    local_398.data[0] = 0xff;
    local_398.data[1] = 0xff;
    local_398.data[2] = 0xff;
    local_398.data[3] = 0xff;
    local_398.data[4] = 0xff;
    local_398.data[5] = 0xff;
    local_398.data[6] = 0xff;
    local_398.data[7] = 0xff;
    local_398.data[8] = 0xff;
    local_398.data[9] = 0xff;
    local_398.data[10] = 0xff;
    local_398.data[0xb] = 0xff;
    local_398.data[0xc] = 0xff;
    local_398.data[0xd] = 0xff;
    local_398.data[0xe] = 0xff;
    local_398.data[0xf] = 0xff;
    local_168[0x30] = 0xf2;
    local_168[0x31] = '_';
    local_168[0x32] = 0xd7;
    local_168[0x33] = 0x88;
    local_168[0x34] = 0x81;
    local_168[0x35] = 0xeb;
    local_168[0x36] = 0xb3;
    local_168[0x37] = '\'';
    local_168[0x38] = 'q';
    local_168[0x39] = 0xfc;
    local_168[0x3a] = 'Y';
    local_168[0x3b] = '\"';
    local_168[0x3c] = 0xef;
    local_168[0x3d] = 0xc6;
    local_168[0x3e] = 'n';
    local_168[0x3f] = 0xa3;
    local_168._32_8_ = 0x93b33db19c2b5897;
    local_168[0x28] = '7';
    local_168[0x29] = '\x05';
    local_168[0x2a] = 0xb3;
    local_168[0x2b] = '+';
    local_168[0x2c] = 0xa9;
    local_168[0x2d] = 0x82;
    local_168[0x2e] = 0xaf;
    local_168[0x2f] = 'Z';
    local_168._16_8_ = 0xb651dd87a1c1ec65;
    local_168._24_8_ = 0xecd53796dc1eda4f;
    local_168._0_8_ = 0xf146e2579750b07e;
    local_168._8_8_ = 0xb91c615156884994;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288,local_398.data,0x20,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,0x20,local_168,1);
    local_228._16_8_ = 0xaae28b6d7430fa7d;
    local_228._24_8_ = 0xb9c72dd2295f9765;
    local_228._0_8_ = 0x12e499bb09359cd6;
    local_228._8_8_ = 0x83724e54e80f8be6;
    local_348 = (uchar *)0x9b591ac87578f199;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x36769b989986c56;
    local_358 = (undefined1  [8])0xb283cc8ff6c3f34d;
    puStack_350 = (uchar *)0x24a73104c9429d7e;
    local_168[0x30] = '`';
    local_168[0x31] = 0xcb;
    local_168[0x32] = 'q';
    local_168[0x33] = 0xc0;
    local_168[0x34] = 'N';
    local_168[0x35] = 0x80;
    local_168[0x36] = 0xf5;
    local_168[0x37] = 0x93;
    local_168[0x38] = '\x06';
    local_168[0x39] = '\v';
    local_168[0x3a] = '\a';
    local_168[0x3b] = 0xd2;
    local_168[0x3c] = 0x83;
    local_168[0x3d] = '\b';
    local_168[0x3e] = 0xd7;
    local_168[0x3f] = 0xf4;
    local_168._32_8_ = 0xb303f68a54b1af76;
    local_168[0x28] = 0xeb;
    local_168[0x29] = 'E';
    local_168[0x2a] = 0xc9;
    local_168[0x2b] = 0xf8;
    local_168[0x2c] = ' ';
    local_168[0x2d] = '}';
    local_168[0x2e] = 0xee;
    local_168[0x2f] = '\x10';
    local_168._16_8_ = 0x28aaf51494eda089;
    local_168._24_8_ = 0x639c5f79d6960dad;
    local_168._0_8_ = 0;
    local_168._8_8_ = 0x3f56ce783b000000;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,1);
    local_228._16_8_ = 0x8776b979ae9898eb;
    local_228._24_8_ = 0x344a2d4aa0fae466;
    local_228._0_8_ = 0x507767db4ceafdee;
    local_228._8_8_ = 0x21cfea07e8fe20a4;
    a_00 = (secp256k1_fe *)local_168;
    psVar15 = CTX;
    iVar17 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)a_00,local_228);
    if (iVar17 != 0) goto LAB_0013fdcf;
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 'z';
    local_168[0x31] = 's';
    local_168[0x32] = 0xc6;
    local_168[0x33] = 'C';
    local_168[0x34] = 0xe1;
    local_168[0x35] = 'f';
    local_168[0x36] = 0xbe;
    local_168[0x37] = '^';
    local_168[0x38] = 0xbe;
    local_168[0x39] = 0xaf;
    local_168[0x3a] = 0xa3;
    local_168[0x3b] = 'K';
    local_168[0x3c] = '\x1a';
    local_168[0x3d] = 0xc5;
    local_168[0x3e] = 'S';
    local_168[0x3f] = 0xe2;
    local_168._32_8_ = 0x7c60a644479c23c;
    local_168[0x28] = 0xcd;
    local_168[0x29] = '\x10';
    local_168[0x2a] = 'z';
    local_168[0x2b] = 0xe1;
    local_168[0x2c] = '\t';
    local_168[0x2d] = '#';
    local_168[0x2e] = 0xd9;
    local_168[0x2f] = 0xef;
    local_168._16_8_ = 0x8ba168852f47f682;
    local_168._24_8_ = 0x56752960147a052f;
    local_168._0_8_ = 0xa4ee5e75d57bf9ff;
    local_168._8_8_ = 0xd3355235143a4520;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 'b';
    local_168[0x31] = '*';
    local_168[0x32] = 0x95;
    local_168[0x33] = 'L';
    local_168[0x34] = 0xfe;
    local_168[0x35] = 'T';
    local_168[0x36] = 'W';
    local_168[0x37] = '5';
    local_168[0x38] = 0xaa;
    local_168[0x39] = 0xea;
    local_168[0x3a] = 'Q';
    local_168[0x3b] = '4';
    local_168[0x3c] = 0xfc;
    local_168[0x3d] = 0xcd;
    local_168[0x3e] = 0xb2;
    local_168[0x3f] = 0xbd;
    local_168._32_8_ = 0x89716edb3e0b8928;
    local_168[0x28] = 0xb6;
    local_168[0x29] = '0';
    local_168[0x2a] = 'D';
    local_168[0x2b] = 0x8b;
    local_168[0x2c] = 'Q';
    local_168[0x2d] = '\\';
    local_168[0x2e] = 0xe4;
    local_168[0x2f] = 0xf8;
    local_168._16_8_ = 0xf46f3fdf13b032b4;
    local_168._24_8_ = 0x5f51e1e033cb9ff9;
    local_168._0_8_ = 0x1cc2db1e332ea61f;
    local_168._8_8_ = 0xa70011abd2924739;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 0xe8;
    local_168[0x31] = 0xd7;
    local_168[0x32] = 0xc9;
    local_168[0x33] = '>';
    local_168[0x34] = '\0';
    local_168[0x35] = 0xc5;
    local_168[0x36] = 0xed;
    local_168[0x37] = '\f';
    local_168[0x38] = '\x18';
    local_168[0x39] = '4';
    local_168[0x3a] = 0xff;
    local_168[0x3b] = '\r';
    local_168[0x3c] = '\f';
    local_168[0x3d] = '.';
    local_168[0x3e] = 'm';
    local_168[0x3f] = 0xa6;
    local_168._32_8_ = 0xfc2f9baab3641796;
    local_168[0x28] = 0xb6;
    local_168[0x29] = 0xef;
    local_168[0x2a] = 0x94;
    local_168[0x2b] = '{';
    local_168[0x2c] = 'h';
    local_168[0x2d] = 0x87;
    local_168[0x2e] = 0xa2;
    local_168[0x2f] = '&';
    local_168._16_8_ = 0x96d9b2896097c174;
    local_168._24_8_ = 0x6977173e54e5a23d;
    local_168._0_8_ = 0xea696ca83b5cff6c;
    local_168._8_8_ = 0x4fcb9b1af376734b;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 'O';
    local_168[0x31] = 0xb7;
    local_168[0x32] = '4';
    local_168[0x33] = 'v';
    local_168[0x34] = 0xf0;
    local_168[0x35] = 0xd5;
    local_168[0x36] = 0x94;
    local_168[0x37] = 0xdc;
    local_168[0x38] = 0xb6;
    local_168[0x39] = '\\';
    local_168[0x3a] = 'd';
    local_168[0x3b] = '%';
    local_168[0x3c] = 0xbd;
    local_168[0x3d] = '\x18';
    local_168[0x3e] = '`';
    local_168[0x3f] = 'Q';
    local_168._32_8_ = 0x239caf2883da3d12;
    local_168[0x28] = 0xa9;
    local_168[0x29] = 'L';
    local_168[0x2a] = '\x1f';
    local_168[0x2b] = 0xee;
    local_168[0x2c] = 0xcf;
    local_168[0x2d] = 0xd1;
    local_168[0x2e] = '#';
    local_168[0x2f] = 0xba;
    local_168._16_8_ = 0;
    local_168._24_8_ = 0;
    local_168._0_8_ = 0;
    local_168._8_8_ = 0;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 0xdb;
    local_168[0x31] = 0xa8;
    local_168[0x32] = '\x7f';
    local_168[0x33] = '\x11';
    local_168[0x34] = 0xac;
    local_168[0x35] = 'g';
    local_168[0x36] = 'T';
    local_168[0x37] = 0xf9;
    local_168[0x38] = '7';
    local_168[0x39] = 0x80;
    local_168[0x3a] = 0xd5;
    local_168[0x3b] = 0xa1;
    local_168[0x3c] = 0x83;
    local_168[0x3d] = '|';
    local_168[0x3e] = 0xf1;
    local_168[0x3f] = 0x97;
    local_168._32_8_ = 0x6488e25aaffb1576;
    local_168[0x28] = '\x01';
    local_168[0x29] = '<';
    local_168[0x2a] = '\t';
    local_168[0x2b] = 0x97;
    local_168[0x2c] = 'B';
    local_168[0x2d] = 0xde;
    local_168[0x2e] = 0xad;
    local_168[0x2f] = 0xb4;
    local_168._16_8_ = 0;
    local_168._24_8_ = 0x100000000000000;
    local_168._0_8_ = 0;
    local_168._8_8_ = 0;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 0xd1;
    local_168[0x31] = 0xd7;
    local_168[0x32] = '\x13';
    local_168[0x33] = 0xa8;
    local_168[0x34] = 0xae;
    local_168[0x35] = 0x82;
    local_168[0x36] = 0xb3;
    local_168[0x37] = '/';
    local_168[0x38] = 0xa7;
    local_168[0x39] = 0x9d;
    local_168[0x3a] = '_';
    local_168[0x3b] = '\x7f';
    local_168[0x3c] = 0xc4;
    local_168[0x3d] = '\a';
    local_168[0x3e] = 0xd3;
    local_168[0x3f] = 0x9b;
    local_168._32_8_ = 0x3d064554c9be869;
    local_168[0x28] = 'I';
    local_168[0x29] = '\x10';
    local_168[0x2a] = 'k';
    local_168[0x2b] = 0x84;
    local_168[0x2c] = 0x97;
    local_168[0x2d] = 'x';
    local_168[0x2e] = ']';
    local_168[0x2f] = 0xd7;
    local_168._16_8_ = 0xc79b260f2ba84d56;
    local_168._24_8_ = 0x1dba290422f8740a;
    local_168._0_8_ = 0x5a3957aeac8d294a;
    local_168._8_8_ = 0xcb1dfddb5d79d015;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 0xd1;
    local_168[0x31] = 0xd7;
    local_168[0x32] = '\x13';
    local_168[0x33] = 0xa8;
    local_168[0x34] = 0xae;
    local_168[0x35] = 0x82;
    local_168[0x36] = 0xb3;
    local_168[0x37] = '/';
    local_168[0x38] = 0xa7;
    local_168[0x39] = 0x9d;
    local_168[0x3a] = '_';
    local_168[0x3b] = '\x7f';
    local_168[0x3c] = 0xc4;
    local_168[0x3d] = '\a';
    local_168[0x3e] = 0xd3;
    local_168[0x3f] = 0x9b;
    local_168._32_8_ = 0x3d064554c9be869;
    local_168[0x28] = 'I';
    local_168[0x29] = '\x10';
    local_168[0x2a] = 'k';
    local_168[0x2b] = 0x84;
    local_168[0x2c] = 0x97;
    local_168[0x2d] = 'x';
    local_168[0x2e] = ']';
    local_168[0x2f] = 0xd7;
    local_168._16_8_ = 0xffffffffffffffff;
    local_168._24_8_ = 0x2ffcfffffeffffff;
    local_168._0_8_ = 0xffffffffffffffff;
    local_168._8_8_ = 0xffffffffffffffff;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 0xba;
    local_168[0x31] = 0xae;
    local_168[0x32] = 0xdc;
    local_168[0x33] = 0xe6;
    local_168[0x34] = 0xaf;
    local_168[0x35] = 'H';
    local_168[0x36] = 0xa0;
    local_168[0x37] = ';';
    local_168[0x38] = 0xbf;
    local_168[0x39] = 0xd2;
    local_168[0x3a] = '^';
    local_168[0x3b] = 0x8c;
    local_168[0x3c] = 0xd0;
    local_168[0x3d] = '6';
    local_168[0x3e] = 'A';
    local_168[0x3f] = 'A';
    local_168._32_8_ = 0xffffffffffffffff;
    local_168[0x28] = 0xff;
    local_168[0x29] = 0xff;
    local_168[0x2a] = 0xff;
    local_168[0x2b] = 0xff;
    local_168[0x2c] = 0xff;
    local_168[0x2d] = 0xff;
    local_168[0x2e] = 0xff;
    local_168[0x2f] = 0xfe;
    local_168._16_8_ = 0x96d9b2896097c174;
    local_168._24_8_ = 0x6977173e54e5a23d;
    local_168._0_8_ = 0xea696ca83b5cff6c;
    local_168._8_8_ = 0x4fcb9b1af376734b;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xffffffffffffffff;
    local_228._24_8_ = 0x30fcfffffeffffff;
    local_228._0_8_ = 0xffffffffffffffff;
    local_228._8_8_ = 0xffffffffffffffff;
    a_00 = (secp256k1_fe *)local_168;
    psVar15 = CTX;
    iVar17 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)a_00,local_228);
    if (iVar17 != 0) goto LAB_0013fdd4;
    local_228._16_8_ = 0x4003400340034003;
    local_228._24_8_ = 0x4003400340034003;
    local_228._0_8_ = 0x4003400340034003;
    local_228._8_8_ = 0x4003400340034003;
    local_348 = (uchar *)0x238be6f6b6faf94b;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_358 = (undefined1  [8])0xc43a39b453aa8c77;
    puStack_350 = (uchar *)0x22877a49094d7767;
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    local_168[0x30] = 0x9f;
    local_168[0x31] = '-';
    local_168[0x32] = 'V';
    local_168[0x33] = '\x0f';
    local_168[0x34] = 0xac;
    local_168[0x35] = 'e';
    local_168[0x36] = '(';
    local_168[0x37] = '\'';
    local_168[0x38] = 0xd1;
    local_168[0x39] = 0xaf;
    local_168[0x3a] = '\x05';
    local_168[0x3b] = 't';
    local_168[0x3c] = 0xe4;
    local_168[0x3d] = '\'';
    local_168[0x3e] = 0xab;
    local_168[0x3f] = 'c';
    local_168._32_8_ = 0x624603bf26ce6960;
    local_168[0x28] = '(';
    local_168[0x29] = 0xf1;
    local_168[0x2a] = 0x9a;
    local_168[0x2b] = ':';
    local_168[0x2c] = 'b';
    local_168[0x2d] = 0xdb;
    local_168[0x2e] = 0x8a;
    local_168[0x2f] = 'd';
    local_168._16_8_ = 0xccfc326743adb66b;
    local_168._24_8_ = 0xcf645489551a2925;
    local_168._0_8_ = 0xfbd9ec65b15d5371;
    local_168._8_8_ = 0x1861eafa5f6e04bc;
    local_2b8.magnitude = 0;
    local_2b8.normalized = 0;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288,(uchar *)0x0,0,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,(uchar *)0x0,0,local_168,1);
    local_228._16_8_ = 0x4003400340034003;
    local_228._24_8_ = 0x4003400340034003;
    local_228._0_8_ = 0x4003400340034003;
    local_228._8_8_ = 0x4003400340034003;
    local_348 = (uchar *)0x238be6f6b6faf94b;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_358 = (undefined1  [8])0xc43a39b453aa8c77;
    puStack_350 = (uchar *)0x22877a49094d7767;
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    local_398.data[0] = '\x11';
    local_168[0x30] = 0xfe;
    local_168[0x31] = '|';
    local_168[0x32] = 0xac;
    local_168[0x33] = 0xfc;
    local_168[0x34] = 'Z';
    local_168[0x35] = 'W';
    local_168[0x36] = '}';
    local_168[0x37] = '3';
    local_168[0x38] = 0xec;
    local_168[0x39] = '\x14';
    local_168[0x3a] = 'V';
    local_168[0x3b] = 'L';
    local_168[0x3c] = 0xec;
    local_168[0x3d] = '+';
    local_168[0x3e] = 0xac;
    local_168[0x3f] = 0xbf;
    local_168._32_8_ = 0xbd8366eabf7331ea;
    local_168[0x28] = '\x10';
    local_168[0x29] = '\x1f';
    local_168[0x2a] = 0xa5;
    local_168[0x2b] = 0xaa;
    local_168[0x2c] = ']';
    local_168[0x2d] = 0xbc;
    local_168[0x2e] = '\x19';
    local_168[0x2f] = 0x96;
    local_168._16_8_ = 0x354c3be64a93b9b1;
    local_168._24_8_ = 0x3a3c63411aef311;
    local_168._0_8_ = 0x2441f6fe0a0aa208;
    local_168._8_8_ = 0x3a583c69e0329264;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288,local_398.data,1,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,1,local_168,1);
    local_228._16_8_ = 0x4003400340034003;
    local_228._24_8_ = 0x4003400340034003;
    local_228._0_8_ = 0x4003400340034003;
    local_228._8_8_ = 0x4003400340034003;
    local_348 = (uchar *)0x238be6f6b6faf94b;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_358 = (undefined1  [8])0xc43a39b453aa8c77;
    puStack_350 = (uchar *)0x22877a49094d7767;
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    builtin_memcpy(local_398.data,"\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10\x11",0x11);
    local_168[0x30] = 0xe1;
    local_168[0x31] = 0xe5;
    local_168[0x32] = 0xa3;
    local_168[0x33] = '\x7f';
    local_168[0x34] = 0xd8;
    local_168[0x35] = '\x0e';
    local_168[0x36] = 'Z';
    local_168[0x37] = 'Q';
    local_168[0x38] = 0x89;
    local_168[0x39] = '|';
    local_168[0x3a] = 'U';
    local_168[0x3b] = 'f';
    local_168[0x3c] = 0xa9;
    local_168[0x3d] = '~';
    local_168[0x3e] = 0xa5;
    local_168[0x3f] = 0xa5;
    local_168._32_8_ = 0xf860f97bb782a4c4;
    local_168[0x28] = 'h';
    local_168[0x29] = '\x15';
    local_168[0x2a] = '@';
    local_168[0x2b] = 0xe2;
    local_168[0x2c] = '[';
    local_168[0x2d] = 'g';
    local_168[0x2e] = 'q';
    local_168[0x2f] = 0xec;
    local_168._16_8_ = 0x523c1ea7d199865d;
    local_168._24_8_ = 0x70c30ab5b6fd9ada;
    local_168._0_8_ = 0x3bb459409af33051;
    local_168._8_8_ = 0x2be5ec199ac0cac7;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288,local_398.data,0x11,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,0x11,local_168,1);
    local_348 = (uchar *)0x4003400340034003;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
    local_358 = (undefined1  [8])0x4003400340034003;
    puStack_350 = (uchar *)0x4003400340034003;
    local_278._8_8_ = 0x17d16f4d32976408;
    local_278._0_8_ = 0x238be6f6b6faf94b;
    local_288._8_8_ = 0x22877a49094d7767;
    local_288._0_8_ = 0xc43a39b453aa8c77;
    local_398.data[0x10] = '\0';
    local_398.data[0x11] = '\0';
    local_398.data[0x12] = '\0';
    local_398.data[0x13] = '\0';
    local_398.data[0x14] = '\0';
    local_398.data[0x15] = '\0';
    local_398.data[0x16] = '\0';
    local_398.data[0x17] = '\0';
    local_398.data[0x18] = '\0';
    local_398.data[0x19] = '\0';
    local_398.data[0x1a] = '\0';
    local_398.data[0x1b] = '\0';
    local_398.data[0x1c] = '\0';
    local_398.data[0x1d] = '\0';
    local_398.data[0x1e] = '\0';
    local_398.data[0x1f] = '\0';
    local_398.data[0] = '\0';
    local_398.data[1] = '\0';
    local_398.data[2] = '\0';
    local_398.data[3] = '\0';
    local_398.data[4] = '\0';
    local_398.data[5] = '\0';
    local_398.data[6] = '\0';
    local_398.data[7] = '\0';
    local_398.data[8] = '\0';
    local_398.data[9] = '\0';
    local_398.data[10] = '\0';
    local_398.data[0xb] = '\0';
    local_398.data[0xc] = '\0';
    local_398.data[0xd] = '\0';
    local_398.data[0xe] = '\0';
    local_398.data[0xf] = '\0';
    local_228._48_8_ = 0xa0b4d0e9a0cb7f89;
    local_228._56_8_ = 0x6723f249d2cf9468;
    local_228._32_8_ = 0xe7070817e3d35e58;
    local_228[0x28] = 0xc0;
    local_228[0x29] = ';';
    local_228[0x2a] = 'r';
    local_228[0x2b] = '\x0f';
    local_228[0x2c] = 0xc5;
    local_228[0x2d] = 'L';
    local_228[0x2e] = '{';
    local_228[0x2f] = '#';
    local_228._16_8_ = 0x6fbea8bf5d1e3203;
    local_228._24_8_ = 0xa879ca3e16351609;
    local_228._0_8_ = 0x345a55d8b0123b40;
    local_228._8_8_ = 0x635646c77eea7541;
    local_168[0x50] = 0x99;
    local_168[0x51] = 0x99;
    local_168[0x52] = 0x99;
    local_168[0x53] = 0x99;
    local_168[0x54] = 0x99;
    local_168[0x55] = 0x99;
    local_168[0x56] = 0x99;
    local_168[0x57] = 0x99;
    local_168[0x58] = 0x99;
    local_168[0x59] = 0x99;
    local_168[0x5a] = 0x99;
    local_168[0x5b] = 0x99;
    local_168[0x5c] = 0x99;
    local_168[0x5d] = 0x99;
    local_168[0x5e] = 0x99;
    local_168[0x5f] = 0x99;
    local_168[0x40] = 0x99;
    local_168[0x41] = 0x99;
    local_168[0x42] = 0x99;
    local_168[0x43] = 0x99;
    local_168[0x44] = 0x99;
    local_168[0x45] = 0x99;
    local_168[0x46] = 0x99;
    local_168[0x47] = 0x99;
    local_168[0x48] = 0x99;
    local_168[0x49] = 0x99;
    local_168[0x4a] = 0x99;
    local_168[0x4b] = 0x99;
    local_168[0x4c] = 0x99;
    local_168[0x4d] = 0x99;
    local_168[0x4e] = 0x99;
    local_168[0x4f] = 0x99;
    local_168[0x30] = 0x99;
    local_168[0x31] = 0x99;
    local_168[0x32] = 0x99;
    local_168[0x33] = 0x99;
    local_168[0x34] = 0x99;
    local_168[0x35] = 0x99;
    local_168[0x36] = 0x99;
    local_168[0x37] = 0x99;
    local_168[0x38] = 0x99;
    local_168[0x39] = 0x99;
    local_168[0x3a] = 0x99;
    local_168[0x3b] = 0x99;
    local_168[0x3c] = 0x99;
    local_168[0x3d] = 0x99;
    local_168[0x3e] = 0x99;
    local_168[0x3f] = 0x99;
    local_168._32_8_ = 0x9999999999999999;
    local_168[0x28] = 0x99;
    local_168[0x29] = 0x99;
    local_168[0x2a] = 0x99;
    local_168[0x2b] = 0x99;
    local_168[0x2c] = 0x99;
    local_168[0x2d] = 0x99;
    local_168[0x2e] = 0x99;
    local_168[0x2f] = 0x99;
    local_168._16_8_ = 0x9999999999999999;
    local_168._24_8_ = 0x9999999999999999;
    local_168._0_8_ = 0x9999999999999999;
    local_168._8_8_ = 0x9999999999999999;
    local_168._96_4_ = 0x99999999;
    test_schnorrsig_bip_vectors_check_signing
              (local_358,local_288,local_398.data,local_168,100,local_228);
    test_schnorrsig_bip_vectors_check_verify(local_288,local_168,100,local_228,1);
    if (COUNT < 1) {
LAB_0013f844:
      testrand256(local_398.data);
      a_00 = (secp256k1_fe *)local_168;
      psVar15 = CTX;
      iVar17 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)a_00,local_398.data);
      if (iVar17 == 0) goto LAB_0013fdd9;
      a_00 = (secp256k1_fe *)local_228;
      psVar15 = CTX;
      iVar17 = secp256k1_keypair_xonly_pub
                         (CTX,(secp256k1_xonly_pubkey *)a_00,(int *)0x0,
                          (secp256k1_keypair *)local_168);
      if (iVar17 == 0) goto LAB_0013fdde;
      a_00 = (secp256k1_fe *)(local_2f8 + 0x20);
      psVar15 = CTX;
      iVar17 = secp256k1_xonly_pubkey_serialize
                         (CTX,(uchar *)a_00,(secp256k1_xonly_pubkey *)local_228);
      if (iVar17 == 0) goto LAB_0013fde3;
      a_00 = (secp256k1_fe *)local_168;
      psVar15 = CTX;
      iVar17 = secp256k1_keypair_xonly_tweak_add(CTX,(secp256k1_keypair *)a_00,local_2f8 + 0x20);
      if (iVar17 != 1) goto LAB_0013fde8;
      a_00 = (secp256k1_fe *)local_358;
      psVar15 = CTX;
      iVar17 = secp256k1_keypair_xonly_pub
                         (CTX,(secp256k1_xonly_pubkey *)a_00,(int *)&local_3b8,
                          (secp256k1_keypair *)local_168);
      if (iVar17 == 0) goto LAB_0013fded;
      a_00 = (secp256k1_fe *)local_2f8;
      psVar15 = CTX;
      iVar17 = secp256k1_xonly_pubkey_serialize
                         (CTX,(uchar *)a_00,(secp256k1_xonly_pubkey *)local_358);
      if (iVar17 == 0) goto LAB_0013fdf2;
      testrand256(local_3d8);
      a_00 = (secp256k1_fe *)local_288;
      psVar15 = CTX;
      iVar17 = secp256k1_schnorrsig_sign_internal
                         (CTX,(uchar *)a_00,local_3d8,0x20,(secp256k1_keypair *)local_168,
                          nonce_function_bip340,(void *)0x0);
      if (iVar17 == 0) goto LAB_0013fdf7;
      a_00 = (secp256k1_fe *)local_358;
      psVar15 = CTX;
      iVar17 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)a_00,local_2f8);
      if (iVar17 == 0) goto LAB_0013fdfc;
      a_00 = (secp256k1_fe *)local_288;
      psVar15 = CTX;
      iVar17 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)a_00,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_358);
      if (iVar17 == 0) goto LAB_0013fe01;
      a_00 = &local_2b8;
      psVar15 = CTX;
      iVar17 = secp256k1_xonly_pubkey_serialize
                         (CTX,(uchar *)a_00,(secp256k1_xonly_pubkey *)local_228);
      if (iVar17 == 0) goto LAB_0013fe06;
      a_00 = (secp256k1_fe *)local_228;
      psVar15 = CTX;
      iVar17 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)a_00,(uchar *)&local_2b8);
      if (iVar17 != 0) {
        a_00 = (secp256k1_fe *)local_2f8;
        psVar15 = CTX;
        iVar17 = secp256k1_xonly_pubkey_tweak_add_check
                           (CTX,(uchar *)a_00,(int)local_3b8.magic,
                            (secp256k1_xonly_pubkey *)local_228,local_2f8 + 0x20);
        if (iVar17 != 0) {
          return;
        }
        goto LAB_0013fe10;
      }
      goto LAB_0013fe0b;
    }
    while( true ) {
      pubkey = (secp256k1_xonly_pubkey *)local_228;
      local_2f8._16_8_ = 0x6e68637320612072;
      local_2f8._24_8_ = 0x2e2e67697372726f;
      local_2f8._0_8_ = 0x2073692073696874;
      local_2f8._8_8_ = 0x6f662067736d2061;
      local_398.data[0x30] = '\0';
      local_398.data[0x31] = '\0';
      local_398.data[0x32] = '\0';
      local_398.data[0x33] = '\0';
      local_398.data[0x34] = '\0';
      local_398.data[0x35] = '\0';
      local_398.data[0x36] = '\0';
      local_398.data[0x37] = '\0';
      local_398.data[0x38] = '\0';
      local_398.data[0x39] = '\0';
      local_398.data[0x3a] = '\0';
      local_398.data[0x3b] = '\0';
      local_398.data[0x3c] = '\0';
      local_398.data[0x3d] = '\0';
      local_398.data[0x3e] = '\0';
      local_398.data[0x3f] = '\0';
      local_398.data[0x20] = '\0';
      local_398.data[0x21] = '\0';
      local_398.data[0x22] = '\0';
      local_398.data[0x23] = '\0';
      local_398.data[0x24] = '\0';
      local_398.data[0x25] = '\0';
      local_398.data[0x26] = '\0';
      local_398.data[0x27] = '\0';
      local_398.data._40_8_ = 0;
      local_398.data[0x10] = '\0';
      local_398.data[0x11] = '\0';
      local_398.data[0x12] = '\0';
      local_398.data[0x13] = '\0';
      local_398.data[0x14] = '\0';
      local_398.data[0x15] = '\0';
      local_398.data[0x16] = '\0';
      local_398.data[0x17] = '\0';
      local_398.data[0x18] = '\0';
      local_398.data[0x19] = '\0';
      local_398.data[0x1a] = '\0';
      local_398.data[0x1b] = '\0';
      local_398.data[0x1c] = '\0';
      local_398.data[0x1d] = '\0';
      local_398.data[0x1e] = '\0';
      local_398.data[0x1f] = '\0';
      local_398.data[0] = '\0';
      local_398.data[1] = '\0';
      local_398.data[2] = '\0';
      local_398.data[3] = '\0';
      local_398.data[4] = '\0';
      local_398.data[5] = '\0';
      local_398.data[6] = '\0';
      local_398.data[7] = '\0';
      local_398.data[8] = '\0';
      local_398.data[9] = '\0';
      local_398.data[10] = '\0';
      local_398.data[0xb] = '\0';
      local_398.data[0xc] = '\0';
      local_398.data[0xd] = '\0';
      local_398.data[0xe] = '\0';
      local_398.data[0xf] = '\0';
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_3c8._8_8_;
      local_3c8 = auVar6 << 0x40;
      local_3d8 = ZEXT816(0x8cb36fda);
      testrand256((uchar *)&local_2b8);
      testrand256(local_2f8 + 0x20);
      iVar17 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,(uchar *)&local_2b8);
      if (iVar17 == 0) break;
      iVar17 = secp256k1_keypair_xonly_pub(CTX,pubkey,(int *)0x0,(secp256k1_keypair *)local_168);
      if (iVar17 == 0) goto LAB_0013fa69;
      iVar17 = secp256k1_schnorrsig_sign_internal
                         (CTX,local_358,local_2f8,0x20,(secp256k1_keypair *)local_168,
                          nonce_function_bip340,(void *)0x0);
      if (iVar17 == 0) goto LAB_0013fa6e;
      iVar17 = secp256k1_schnorrsig_verify(CTX,local_358,local_2f8,0x20,pubkey);
      if (iVar17 == 0) goto LAB_0013fa73;
      a_00 = (secp256k1_fe *)local_288;
      psVar15 = CTX;
      iVar17 = secp256k1_schnorrsig_sign_internal
                         (CTX,(uchar *)local_288,local_2f8,0x20,(secp256k1_keypair *)local_168,
                          nonce_function_bip340,(void *)0x0);
      if (iVar17 == 0) goto LAB_0013fa78;
      lVar14 = 0;
      do {
        if (local_358[lVar14] != local_288[lVar14]) goto LAB_0013fe15;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x40);
      a_00 = (secp256k1_fe *)local_358;
      iVar17 = secp256k1_schnorrsig_sign_custom
                         (CTX,(uchar *)a_00,local_2f8,0x20,(secp256k1_keypair *)local_168,
                          (secp256k1_schnorrsig_extraparams *)local_3d8);
      if (iVar17 == 0) goto LAB_0013fa7d;
      iVar17 = secp256k1_schnorrsig_verify(CTX,(uchar *)a_00,local_2f8,0x20,pubkey);
      if (iVar17 == 0) goto LAB_0013fa82;
      local_328._8_8_ = 0x101010101010101;
      local_328._0_8_ = 0x101010101010101;
      local_338 = (uchar *)0x101010101010101;
      uStack_330 = 0x101010101010101;
      local_348 = (uchar *)0x101010101010101;
      psStack_340 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_358 = (undefined1  [8])0x101010101010101;
      puStack_350 = (uchar *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_failing;
      psVar15 = CTX;
      iVar17 = secp256k1_schnorrsig_sign_custom
                         (CTX,(uchar *)a_00,local_2f8,0x20,(secp256k1_keypair *)local_168,
                          (secp256k1_schnorrsig_extraparams *)local_3d8);
      if (iVar17 != 0) goto LAB_0013fa87;
      lVar14 = 0;
      do {
        if (local_358[lVar14] != local_398.data[lVar14]) goto LAB_0013fe1a;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x40);
      local_328._8_8_ = 0x101010101010101;
      local_328._0_8_ = 0x101010101010101;
      local_338 = (uchar *)0x101010101010101;
      uStack_330 = 0x101010101010101;
      local_348 = (uchar *)0x101010101010101;
      psStack_340 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_358 = (undefined1  [8])0x101010101010101;
      puStack_350 = (uchar *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_0;
      a_00 = (secp256k1_fe *)local_358;
      psVar15 = CTX;
      iVar17 = secp256k1_schnorrsig_sign_custom
                         (CTX,(uchar *)a_00,local_2f8,0x20,(secp256k1_keypair *)local_168,
                          (secp256k1_schnorrsig_extraparams *)local_3d8);
      if (iVar17 != 0) goto LAB_0013fa8c;
      lVar14 = 0;
      do {
        if (local_358[lVar14] != local_398.data[lVar14]) goto LAB_0013fe1f;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x40);
      local_328._8_8_ = 0x101010101010101;
      local_328._0_8_ = 0x101010101010101;
      local_338 = (uchar *)0x101010101010101;
      uStack_330 = 0x101010101010101;
      local_348 = (uchar *)0x101010101010101;
      psStack_340 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_358 = (undefined1  [8])0x101010101010101;
      puStack_350 = (uchar *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_overflowing;
      iVar17 = secp256k1_schnorrsig_sign_custom
                         (CTX,local_358,local_2f8,0x20,(secp256k1_keypair *)local_168,
                          (secp256k1_schnorrsig_extraparams *)local_3d8);
      if (iVar17 == 0) goto LAB_0013fa91;
      iVar17 = secp256k1_schnorrsig_verify(CTX,local_358,local_2f8,0x20,pubkey);
      if (iVar17 == 0) goto LAB_0013fa96;
      local_3d8._8_8_ = 0;
      local_3c8._0_8_ = local_2f8 + 0x20;
      iVar17 = secp256k1_schnorrsig_sign_custom
                         (CTX,local_358,local_2f8,0x20,(secp256k1_keypair *)local_168,
                          (secp256k1_schnorrsig_extraparams *)local_3d8);
      if (iVar17 == 0) goto LAB_0013fa9b;
      a_00 = (secp256k1_fe *)local_288;
      psVar15 = CTX;
      iVar17 = secp256k1_schnorrsig_sign_internal
                         (CTX,(uchar *)local_288,local_2f8,0x20,(secp256k1_keypair *)local_168,
                          nonce_function_bip340,(void *)local_3c8._0_8_);
      if (iVar17 == 0) goto LAB_0013faa0;
      lVar14 = 0;
      do {
        if (local_358[lVar14] != local_288[lVar14]) goto LAB_0013fe24;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x40);
      testrand256((uchar *)&local_2b8);
      iVar17 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_288,(uchar *)&local_2b8);
      if (iVar17 == 0) goto LAB_0013faa5;
      iVar17 = secp256k1_keypair_xonly_pub(CTX,&local_398,(int *)0x0,(secp256k1_keypair *)local_288)
      ;
      if (iVar17 == 0) goto LAB_0013faaa;
      lVar14 = 0;
      do {
        puVar20 = local_358 + lVar14;
        testrand256(puVar20);
        iVar17 = secp256k1_schnorrsig_sign_internal
                           (CTX,pubkey->data,puVar20,0x20,(secp256k1_keypair *)local_288,
                            nonce_function_bip340,(void *)0x0);
        if (iVar17 == 0) {
          run_schnorrsig_tests_cold_69();
LAB_0013fa55:
          run_schnorrsig_tests_cold_68();
LAB_0013fa5a:
          run_schnorrsig_tests_cold_100();
LAB_0013fa5f:
          run_schnorrsig_tests_cold_98();
          goto LAB_0013fa64;
        }
        iVar17 = secp256k1_schnorrsig_verify(CTX,pubkey->data,puVar20,0x20,&local_398);
        if (iVar17 == 0) goto LAB_0013fa55;
        lVar14 = lVar14 + 0x20;
        pubkey = pubkey + 1;
      } while (lVar14 != 0x60);
      uVar10 = testrand_int(3);
      uVar21 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar18 = secp256k1_test_state[1] << 0x11;
      uVar19 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar16 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar19;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar16;
      secp256k1_test_state[2] = uVar19 ^ uVar18;
      secp256k1_test_state[3] = uVar16 << 0x2d | uVar16 >> 0x13;
      uVar21 = uVar21 >> 0x3b;
      uVar12 = testrand_int(0xfe);
      sig64 = local_228 + (ulong)uVar10 * 0x40;
      bVar22 = (char)uVar12 + 1;
      sig64[uVar21] = sig64[uVar21] ^ bVar22;
      puVar20 = local_358 + (ulong)uVar10 * 0x20;
      iVar17 = secp256k1_schnorrsig_verify(CTX,sig64,puVar20,0x20,&local_398);
      if (iVar17 != 0) goto LAB_0013faaf;
      sig64[uVar21] = sig64[uVar21] ^ bVar22;
      uVar21 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar18 = secp256k1_test_state[1] << 0x11;
      uVar19 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar16 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar19;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar16;
      secp256k1_test_state[2] = uVar19 ^ uVar18;
      secp256k1_test_state[3] = uVar16 << 0x2d | uVar16 >> 0x13;
      uVar21 = uVar21 >> 0x3b;
      sig64[uVar21 + 0x20] = sig64[uVar21 + 0x20] ^ bVar22;
      iVar17 = secp256k1_schnorrsig_verify(CTX,sig64,puVar20,0x20,&local_398);
      if (iVar17 != 0) goto LAB_0013fab4;
      sig64[uVar21 + 0x20] = sig64[uVar21 + 0x20] ^ bVar22;
      uVar21 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar18 = secp256k1_test_state[1] << 0x11;
      uVar19 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar16 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar19;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar16;
      secp256k1_test_state[2] = uVar19 ^ uVar18;
      secp256k1_test_state[3] = uVar16 << 0x2d | uVar16 >> 0x13;
      uVar21 = uVar21 >> 0x3b;
      puVar20[uVar21] = puVar20[uVar21] ^ bVar22;
      iVar17 = secp256k1_schnorrsig_verify(CTX,sig64,puVar20,0x20,&local_398);
      if (iVar17 != 0) goto LAB_0013fab9;
      puVar20[uVar21] = puVar20[uVar21] ^ bVar22;
      iVar17 = secp256k1_schnorrsig_verify(CTX,sig64,puVar20,0x20,&local_398);
      if (iVar17 == 0) goto LAB_0013fabe;
      iVar17 = secp256k1_schnorrsig_sign_internal
                         (CTX,local_228,local_358,0x20,(secp256k1_keypair *)local_288,
                          nonce_function_bip340,(void *)0x0);
      if (iVar17 == 0) goto LAB_0013fac3;
      iVar17 = secp256k1_schnorrsig_verify(CTX,local_228,local_358,0x20,&local_398);
      if (iVar17 == 0) goto LAB_0013fac8;
      local_228._48_8_ = 0xffffffffffffffff;
      local_228._56_8_ = 0xffffffffffffffff;
      local_228._32_8_ = 0xffffffffffffffff;
      local_228[0x28] = 0xff;
      local_228[0x29] = 0xff;
      local_228[0x2a] = 0xff;
      local_228[0x2b] = 0xff;
      local_228[0x2c] = 0xff;
      local_228[0x2d] = 0xff;
      local_228[0x2e] = 0xff;
      local_228[0x2f] = 0xff;
      iVar17 = secp256k1_schnorrsig_verify(CTX,local_228,local_358,0x20,&local_398);
      if (iVar17 != 0) goto LAB_0013facd;
      iVar17 = secp256k1_schnorrsig_sign_internal
                         (CTX,local_228,local_358,0x20,(secp256k1_keypair *)local_288,
                          nonce_function_bip340,(void *)0x0);
      if (iVar17 == 0) goto LAB_0013fad2;
      iVar17 = secp256k1_schnorrsig_verify(CTX,local_228,local_358,0x20,&local_398);
      if (iVar17 == 0) goto LAB_0013fad7;
      secp256k1_scalar_set_b32((secp256k1_scalar *)local_2f8,local_228 + 0x20,(int *)0x0);
      secp256k1_scalar_negate((secp256k1_scalar *)local_2f8,(secp256k1_scalar *)local_2f8);
      secp256k1_scalar_get_b32(local_228 + 0x20,(secp256k1_scalar *)local_2f8);
      iVar17 = secp256k1_schnorrsig_verify(CTX,local_228,local_358,0x20,&local_398);
      if (iVar17 != 0) goto LAB_0013fadc;
      iVar17 = secp256k1_schnorrsig_sign_custom
                         (CTX,local_228,(uchar *)0x0,0,(secp256k1_keypair *)local_288,
                          (secp256k1_schnorrsig_extraparams *)0x0);
      if (iVar17 == 0) goto LAB_0013fae1;
      iVar17 = secp256k1_schnorrsig_verify(CTX,local_228,(uchar *)0x0,0,&local_398);
      if (iVar17 == 0) goto LAB_0013fae6;
      uVar10 = testrand_int(0x100);
      uVar16 = 0xffffffffffffffe0;
      do {
        testrand256(local_168 + uVar16 + 0x20);
        uVar16 = uVar16 + 0x20;
      } while (uVar16 < 0xe0);
      iVar17 = secp256k1_schnorrsig_sign_custom
                         (CTX,local_228,local_168,(ulong)uVar10,(secp256k1_keypair *)local_288,
                          (secp256k1_schnorrsig_extraparams *)0x0);
      if (iVar17 == 0) goto LAB_0013faeb;
      iVar17 = secp256k1_schnorrsig_verify(CTX,local_228,local_168,(ulong)uVar10,&local_398);
      if (iVar17 == 0) goto LAB_0013faf0;
      iVar17 = secp256k1_schnorrsig_verify
                         (CTX,local_228,local_168,(ulong)(uVar10 - 1 & 0xff),&local_398);
      if (iVar17 != 0) goto LAB_0013faf5;
      uVar13 = local_2b8.magnitude + 1;
      local_2b8._40_8_ = ZEXT48(uVar13);
      if (COUNT <= (int)uVar13) goto LAB_0013f844;
    }
LAB_0013fa64:
    run_schnorrsig_tests_cold_82();
LAB_0013fa69:
    run_schnorrsig_tests_cold_81();
LAB_0013fa6e:
    run_schnorrsig_tests_cold_80();
LAB_0013fa73:
    run_schnorrsig_tests_cold_79();
LAB_0013fa78:
    run_schnorrsig_tests_cold_78();
LAB_0013fa7d:
    run_schnorrsig_tests_cold_77();
LAB_0013fa82:
    run_schnorrsig_tests_cold_76();
LAB_0013fa87:
    run_schnorrsig_tests_cold_36();
LAB_0013fa8c:
    run_schnorrsig_tests_cold_38();
LAB_0013fa91:
    run_schnorrsig_tests_cold_75();
LAB_0013fa96:
    run_schnorrsig_tests_cold_74();
LAB_0013fa9b:
    run_schnorrsig_tests_cold_73();
LAB_0013faa0:
    run_schnorrsig_tests_cold_72();
LAB_0013faa5:
    run_schnorrsig_tests_cold_71();
LAB_0013faaa:
    run_schnorrsig_tests_cold_70();
LAB_0013faaf:
    run_schnorrsig_tests_cold_41();
LAB_0013fab4:
    run_schnorrsig_tests_cold_42();
LAB_0013fab9:
    run_schnorrsig_tests_cold_43();
LAB_0013fabe:
    run_schnorrsig_tests_cold_67();
LAB_0013fac3:
    run_schnorrsig_tests_cold_66();
LAB_0013fac8:
    run_schnorrsig_tests_cold_65();
LAB_0013facd:
    run_schnorrsig_tests_cold_44();
LAB_0013fad2:
    run_schnorrsig_tests_cold_64();
LAB_0013fad7:
    run_schnorrsig_tests_cold_63();
LAB_0013fadc:
    run_schnorrsig_tests_cold_45();
LAB_0013fae1:
    run_schnorrsig_tests_cold_62();
LAB_0013fae6:
    run_schnorrsig_tests_cold_61();
LAB_0013faeb:
    run_schnorrsig_tests_cold_60();
LAB_0013faf0:
    run_schnorrsig_tests_cold_59();
LAB_0013faf5:
    run_schnorrsig_tests_cold_46();
LAB_0013fafa:
    run_schnorrsig_tests_cold_99();
LAB_0013faff:
    run_schnorrsig_tests_cold_97();
LAB_0013fb04:
    run_schnorrsig_tests_cold_102();
LAB_0013fb09:
    run_schnorrsig_tests_cold_101();
LAB_0013fb0e:
    run_schnorrsig_tests_cold_96();
LAB_0013fb13:
    run_schnorrsig_tests_cold_95();
LAB_0013fb18:
    run_schnorrsig_tests_cold_94();
LAB_0013fb1d:
    run_schnorrsig_tests_cold_93();
LAB_0013fb22:
    run_schnorrsig_tests_cold_92();
LAB_0013fb27:
    run_schnorrsig_tests_cold_91();
LAB_0013fb2c:
    run_schnorrsig_tests_cold_90();
LAB_0013fb31:
    run_schnorrsig_tests_cold_89();
LAB_0013fb36:
    run_schnorrsig_tests_cold_88();
    psVar15 = extraout_RAX;
LAB_0013fb3b:
    (*(psVar15->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar15->illegal_callback).data);
    psVar15 = CTX;
  } while( true );
}

Assistant:

static void run_schnorrsig_tests(void) {
    int i;
    run_nonce_function_bip340_tests();

    test_schnorrsig_api();
    test_schnorrsig_sha256_tagged();
    test_schnorrsig_bip_vectors();
    for (i = 0; i < COUNT; i++) {
        test_schnorrsig_sign();
        test_schnorrsig_sign_verify();
    }
    test_schnorrsig_taproot();
}